

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall Omega_h::intersect_metrics_dim<2>(Omega_h *this,Reals *a,Reals *b)

{
  int *piVar1;
  Alloc *pAVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  size_t sVar10;
  Reals RVar11;
  Write<double> c;
  type f;
  Write<double> local_78;
  Write<double> local_68;
  type local_58;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar10 = pAVar2->size;
  }
  else {
    sVar10 = (ulong)pAVar2 >> 3;
  }
  iVar9 = (int)(sVar10 >> 3);
  if (iVar9 * -0x55555555 + 0x2aaaaaaaU < 0x55555555) {
    if (((ulong)pAVar2 & 1) == 0) {
      uVar3 = pAVar2->size;
    }
    else {
      uVar3 = (ulong)pAVar2 >> 3;
    }
    pAVar2 = (b->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      uVar4 = pAVar2->size;
    }
    else {
      uVar4 = (ulong)pAVar2 >> 3;
    }
    if ((int)(uVar3 >> 3) == (int)(uVar4 >> 3)) {
      local_58.a.write_.shared_alloc_.alloc = (Alloc *)&local_58.b;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      iVar9 = iVar9 / 3;
      Write<double>::Write(&local_78,iVar9 * 3,(string *)&local_58);
      if (local_58.a.write_.shared_alloc_.alloc != (Alloc *)&local_58.b) {
        operator_delete(local_58.a.write_.shared_alloc_.alloc,
                        (ulong)((long)&(local_58.b.write_.shared_alloc_.alloc)->size + 1));
      }
      local_58.a.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
      if (((ulong)local_58.a.write_.shared_alloc_.alloc & 7) == 0 &&
          local_58.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_58.a.write_.shared_alloc_.alloc =
               (Alloc *)((local_58.a.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_58.a.write_.shared_alloc_.alloc)->use_count =
               (local_58.a.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_58.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
      local_58.b.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
      if (((ulong)local_58.b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_58.b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_58.b.write_.shared_alloc_.alloc =
               (Alloc *)((local_58.b.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_58.b.write_.shared_alloc_.alloc)->use_count =
               (local_58.b.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_58.b.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
      local_58.c.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
      if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
          local_78.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_58.c.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_58.c.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
      parallel_for<Omega_h::intersect_metrics_dim<2>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
                (iVar9,&local_58,"intersect_metrics");
      local_68.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
      local_68.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
      if ((((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
           local_78.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + -1;
        local_68.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_78.shared_alloc_.alloc = (Alloc *)0x0;
      local_78.shared_alloc_.direct_ptr = (void *)0x0;
      Read<double>::Read((Read<signed_char> *)this,&local_68);
      pAVar2 = local_68.shared_alloc_.alloc;
      if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
          local_68.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_68.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      intersect_metrics_dim<2>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::~Read
                ((_lambda_int__1_ *)&local_58);
      pAVar2 = local_78.shared_alloc_.alloc;
      pvVar6 = extraout_RDX;
      if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
          local_78.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_78.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar6 = extraout_RDX_00;
        }
      }
      RVar11.write_.shared_alloc_.direct_ptr = pvVar6;
      RVar11.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Reals)RVar11.write_.shared_alloc_;
    }
    pcVar8 = "a.size() == b.size()";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
    ;
    uVar5 = 0x21a;
  }
  else {
    pcVar8 = "a % b == 0";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
    ;
    uVar5 = 0x11a;
  }
  fail("assertion %s failed at %s +%d\n",pcVar8,pcVar7,uVar5);
}

Assistant:

Reals intersect_metrics_dim(Reals a, Reals b) {
  auto n = divide_no_remainder(a.size(), symm_ncomps(dim));
  OMEGA_H_CHECK(a.size() == b.size());
  auto c = Write<Real>(n * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto am = get_symm<dim>(a, i);
    auto bm = get_symm<dim>(b, i);
    auto cm = intersect_metrics(am, bm);
    set_symm(c, i, cm);
  };
  parallel_for(n, f, "intersect_metrics");
  return c;
}